

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

value signature_metadata_args_map_name(char *name)

{
  value *ppvVar1;
  value pvVar2;
  char *in_RDI;
  value v;
  value *v_array;
  value in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  value *in_stack_ffffffffffffffd0;
  value local_28;
  value local_8;
  
  local_8 = value_create_array(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x122ffc);
    pvVar2 = value_create_string((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000040);
      local_8 = (value)0x0;
    }
    else {
      if (in_RDI == (char *)0x0) {
        local_28 = value_create_string((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      else {
        strlen(in_RDI);
        local_28 = value_create_string(in_RDI,in_stack_ffffffffffffffc8);
      }
      ppvVar1[1] = local_28;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value signature_metadata_args_map_name(const char *name)
{
	static const char name_str[] = "name";

	value *v_array, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);

	v_array[0] = value_create_string(name_str, sizeof(name_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_array[1] = name ? value_create_string(name, strlen(name)) : value_create_string("", 0);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}